

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThrowErrorObject.cpp
# Opt level: O1

ThrowErrorObject *
Js::ThrowErrorObject::New(StaticType *type,JavascriptError *error,Recycler *recycler)

{
  Recycler *alloc;
  ThrowErrorObject *this;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9157c29;
  data.filename._0_4_ = 0x34;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_48);
  this = (ThrowErrorObject *)new<Memory::Recycler>(0x18,alloc,0x38bbb2);
  ThrowErrorObject(this,type,error);
  return this;
}

Assistant:

ThrowErrorObject* ThrowErrorObject::New(StaticType* type, JavascriptError* error, Recycler* recycler)
    {
        return RecyclerNew(recycler, ThrowErrorObject, type, error);
    }